

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arm.cpp
# Opt level: O2

void __thiscall arm::Operand2::display(Operand2 *this,ostream *o)

{
  __index_type _Var1;
  ostream *this_00;
  variant<arm::RegisterOperand,_int> *pvVar2;
  
  _Var1 = *(__index_type *)
           ((long)&(this->super_variant<arm::RegisterOperand,_int>).
                   super__Variant_base<arm::RegisterOperand,_int>.
                   super__Move_assign_alias<arm::RegisterOperand,_int>.
                   super__Copy_assign_alias<arm::RegisterOperand,_int>.
                   super__Move_ctor_alias<arm::RegisterOperand,_int>.
                   super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                   super__Variant_storage_alias<arm::RegisterOperand,_int> + 0x10);
  pvVar2 = &this->super_variant<arm::RegisterOperand,_int>;
  if (_Var1 == '\x01') {
    this_00 = std::operator<<(o,"#");
    std::ostream::operator<<
              (this_00,*(int *)&(pvVar2->super__Variant_base<arm::RegisterOperand,_int>).
                                super__Move_assign_alias<arm::RegisterOperand,_int>.
                                super__Copy_assign_alias<arm::RegisterOperand,_int>.
                                super__Move_ctor_alias<arm::RegisterOperand,_int>.
                                super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                                super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u);
    return;
  }
  if (_Var1 == '\0') {
    (*(code *)**(undefined8 **)
                &(pvVar2->super__Variant_base<arm::RegisterOperand,_int>).
                 super__Move_assign_alias<arm::RegisterOperand,_int>.
                 super__Copy_assign_alias<arm::RegisterOperand,_int>.
                 super__Move_ctor_alias<arm::RegisterOperand,_int>.
                 super__Copy_ctor_alias<arm::RegisterOperand,_int>.
                 super__Variant_storage_alias<arm::RegisterOperand,_int>._M_u)(pvVar2);
    return;
  }
  return;
}

Assistant:

void Operand2::display(std::ostream &o) const {
  if (auto x = std::get_if<RegisterOperand>(this)) {
    x->display(o);
  } else if (auto x = std::get_if<int32_t>(this)) {
    o << "#" << *x;
  }
}